

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvm.cpp
# Opt level: O2

Value * __thiscall Kvm::extendEnvironment(Kvm *this,Value *vars,Value *vals,Value *base_env)

{
  pointer *ppppVVar1;
  Value *pVVar2;
  Value *local_30;
  
  local_30 = (Value *)0x0;
  Kgc::pushLocalStackRoot(&this->gc_,&local_30);
  local_30 = makeCell(this,vars,vals);
  pVVar2 = makeCell(this,local_30,base_env);
  ppppVVar1 = &(this->gc_).localStackRoots_.
               super__Vector_base<const_Value_**,_std::allocator<const_Value_**>_>._M_impl.
               super__Vector_impl_data._M_finish;
  *ppppVVar1 = *ppppVVar1 + -1;
  return pVVar2;
}

Assistant:

const Value* Kvm::extendEnvironment(const Value *vars, const Value *vals, const Value *base_env)
{
    const Value *result = nullptr;
    gc_.pushLocalStackRoot(&result);
    
    result = makeFrame(vars, vals);
    result = makeCell(result, base_env);
    
    gc_.popLocalStackRoot();
    return result;
}